

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathShear.h
# Opt level: O0

Shear6<float> * __thiscall Imath_2_5::Shear6<float>::operator=(Shear6<float> *this,Shear6<float> *h)

{
  Shear6<float> *h_local;
  Shear6<float> *this_local;
  
  this->xy = h->xy;
  this->xz = h->xz;
  this->yz = h->yz;
  this->yx = h->yx;
  this->zx = h->zx;
  this->zy = h->zy;
  return this;
}

Assistant:

inline const Shear6<T> &
Shear6<T>::operator = (const Shear6 &h)
{
    xy = h.xy;
    xz = h.xz;
    yz = h.yz;
    yx = h.yx;
    zx = h.zx;
    zy = h.zy;
    return *this;
}